

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaFalse.c
# Opt level: O3

Gia_Man_t *
Gia_ManCheckFalse2(Gia_Man_t *p,int nSlackMax,int nTimeOut,int fVerbose,int fVeryVerbose)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  void *__ptr;
  bool bVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint *__ptr_00;
  void *pvVar8;
  uint *__ptr_01;
  void *pvVar9;
  Vec_Wec_t *vHooks;
  Vec_Int_t *pVVar10;
  Gia_Man_t *pGVar11;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  int extraout_EDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar16;
  undefined8 extraout_RDX_01;
  size_t sVar17;
  long lVar18;
  uint uVar19;
  uint uVar20;
  long lVar21;
  long lVar22;
  ulong uVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  
  Gia_ManLevelNum(p);
  pVVar10 = p->vCos;
  uVar6 = pVVar10->nSize;
  uVar23 = (ulong)uVar6;
  __ptr_00 = (uint *)malloc(0x10);
  uVar7 = 0x10;
  if (0xe < uVar6 - 1) {
    uVar7 = uVar6;
  }
  __ptr_00[1] = 0;
  *__ptr_00 = uVar7;
  if (uVar7 == 0) {
    pvVar8 = (void *)0x0;
  }
  else {
    pvVar8 = malloc((long)(int)uVar7 << 2);
  }
  puVar1 = __ptr_00 + 2;
  *(void **)(__ptr_00 + 2) = pvVar8;
  if (0 < (int)uVar6) {
    lVar22 = 0;
    do {
      uVar6 = (uint)uVar23;
      iVar5 = pVVar10->pArray[lVar22];
      if ((iVar5 < 0) || (p->nObjs <= iVar5)) goto LAB_0073cf64;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      iVar5 = Gia_ObjLevelId((Gia_Man_t *)p->vLevels,iVar5);
      uVar6 = __ptr_00[1];
      if (uVar6 == *__ptr_00) {
        if ((int)uVar6 < 0x10) {
          if (*(void **)puVar1 == (void *)0x0) {
            pvVar8 = malloc(0x40);
          }
          else {
            pvVar8 = realloc(*(void **)puVar1,0x40);
          }
          *(void **)(__ptr_00 + 2) = pvVar8;
          *__ptr_00 = 0x10;
        }
        else {
          if (*(void **)puVar1 == (void *)0x0) {
            pvVar8 = malloc((ulong)uVar6 * 8);
          }
          else {
            pvVar8 = realloc(*(void **)puVar1,(ulong)uVar6 * 8);
          }
          *(void **)(__ptr_00 + 2) = pvVar8;
          *__ptr_00 = uVar6 * 2;
        }
      }
      else {
        pvVar8 = *(void **)puVar1;
      }
      uVar6 = __ptr_00[1];
      __ptr_00[1] = uVar6 + 1;
      *(float *)((long)pvVar8 + (long)(int)uVar6 * 4) = (float)iVar5;
      lVar22 = lVar22 + 1;
      pVVar10 = p->vCos;
      uVar6 = pVVar10->nSize;
      uVar23 = (ulong)(int)uVar6;
    } while (lVar22 < (long)uVar23);
  }
  __ptr_01 = (uint *)calloc(1,0x20);
  uVar23 = 0x10;
  if (0x10 < (int)uVar6) {
    uVar23 = (ulong)uVar6;
  }
  __ptr_01[1] = 1;
  uVar6 = (int)uVar23 + 1;
  uVar13 = (ulong)uVar6;
  *__ptr_01 = uVar6;
  sVar17 = uVar23 * 4 + 4;
  pvVar9 = malloc(sVar17);
  memset(pvVar9,0xff,sVar17);
  *(void **)(__ptr_01 + 2) = pvVar9;
  pvVar8 = malloc(sVar17);
  memset(pvVar8,0xff,sVar17);
  *(void **)(__ptr_01 + 4) = pvVar8;
  *(uint **)(__ptr_01 + 6) = puVar1;
  if (0 < pVVar10->nSize) {
    uVar6 = 1;
    uVar23 = 0;
    do {
      if ((pVVar10->pArray[uVar23] < 0) || (p->nObjs <= pVVar10->pArray[uVar23])) {
LAB_0073cf64:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      iVar5 = (int)uVar13;
      lVar22 = (long)iVar5;
      if (iVar5 <= (int)uVar6) {
        uVar12 = uVar6 + 1;
        uVar7 = iVar5 * 2;
        if (uVar12 != uVar7 && SBORROW4(uVar12,uVar7) == (int)(uVar12 + iVar5 * -2) < 0) {
          uVar7 = uVar12;
        }
        uVar13 = (ulong)uVar7;
        sVar17 = (long)(int)uVar7 * 4;
        if (pvVar9 == (void *)0x0) {
          pvVar9 = malloc(sVar17);
        }
        else {
          pvVar9 = realloc(pvVar9,sVar17);
        }
        *(void **)(__ptr_01 + 2) = pvVar9;
        if (pvVar8 == (void *)0x0) {
          pvVar8 = malloc(sVar17);
        }
        else {
          pvVar8 = realloc(pvVar8,sVar17);
        }
        *(void **)(__ptr_01 + 4) = pvVar8;
        sVar17 = (long)(int)(uVar7 - iVar5) << 2;
        memset((void *)(lVar22 * 4 + (long)pvVar9),0xff,sVar17);
        memset((void *)((long)pvVar8 + lVar22 * 4),0xff,sVar17);
        *__ptr_01 = uVar7;
        lVar22 = (long)(int)uVar7;
      }
      iVar5 = (int)uVar23;
      if (lVar22 <= (long)uVar23) {
        uVar6 = (int)uVar13 * 2;
        uVar7 = iVar5 + 1;
        if (uVar7 != uVar6 && SBORROW4(uVar7,uVar6) == (int)(uVar7 + (int)uVar13 * -2) < 0) {
          uVar6 = uVar7;
        }
        uVar13 = (ulong)uVar6;
        sVar17 = uVar13 * 4;
        if (pvVar9 == (void *)0x0) {
          pvVar9 = malloc(sVar17);
        }
        else {
          pvVar9 = realloc(pvVar9,sVar17);
          pvVar8 = *(void **)(__ptr_01 + 4);
        }
        *(void **)(__ptr_01 + 2) = pvVar9;
        if (pvVar8 == (void *)0x0) {
          pvVar8 = malloc(sVar17);
        }
        else {
          pvVar8 = realloc(pvVar8,sVar17);
        }
        *(void **)(__ptr_01 + 4) = pvVar8;
        lVar22 = (long)(int)*__ptr_01;
        sVar17 = ((int)uVar6 - lVar22) * 4;
        memset((void *)((long)pvVar9 + lVar22 * 4),0xff,sVar17);
        memset((void *)((long)pvVar8 + lVar22 * 4),0xff,sVar17);
        *__ptr_01 = uVar6;
        uVar6 = __ptr_01[1];
      }
      if ((int)uVar13 <= (int)uVar6) {
        __assert_fail("p->nSize < p->nCap",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                      ,0xe3,"void Vec_QuePush(Vec_Que_t *, int)");
      }
      if (*(int *)((long)pvVar8 + uVar23 * 4) != -1) {
        __assert_fail("p->pOrder[v] == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                      ,0xe4,"void Vec_QuePush(Vec_Que_t *, int)");
      }
      pvVar9 = *(void **)(__ptr_01 + 2);
      lVar22 = (long)(int)uVar6;
      if (*(int *)((long)pvVar9 + lVar22 * 4) != -1) {
        __assert_fail("p->pHeap[p->nSize] == -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                      ,0xe5,"void Vec_QuePush(Vec_Que_t *, int)");
      }
      *(uint *)((long)pvVar8 + uVar23 * 4) = uVar6;
      uVar6 = uVar6 + 1;
      __ptr_01[1] = uVar6;
      *(int *)((long)pvVar9 + lVar22 * 4) = iVar5;
      lVar22 = **(long **)(__ptr_01 + 6);
      if (lVar22 == 0) {
        fVar24 = (float)iVar5;
      }
      else {
        fVar24 = *(float *)(lVar22 + uVar23 * 4);
      }
      uVar7 = *(uint *)((long)pvVar8 + uVar23 * 4);
      uVar14 = (ulong)(int)uVar7;
      if (uVar14 == 0xffffffffffffffff) {
        __assert_fail("p->pOrder[v] != -1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                      ,0xa5,"int Vec_QueMoveUp(Vec_Que_t *, int)");
      }
      if (uVar23 != *(uint *)((long)pvVar9 + uVar14 * 4)) {
        __assert_fail("p->pHeap[i] == v",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                      ,0xa6,"int Vec_QueMoveUp(Vec_Que_t *, int)");
      }
      if (1 < (int)uVar7) {
        do {
          uVar12 = uVar7 >> 1;
          iVar2 = *(int *)((long)pvVar9 + (ulong)uVar12 * 4);
          if (lVar22 == 0) {
            fVar25 = (float)iVar2;
          }
          else {
            fVar25 = *(float *)(lVar22 + (long)iVar2 * 4);
          }
          uVar14 = (ulong)uVar7;
          if (fVar24 <= fVar25) break;
          *(int *)((long)pvVar9 + (ulong)uVar7 * 4) = iVar2;
          *(uint *)((long)pvVar8 + (long)iVar2 * 4) = uVar7;
          bVar4 = 3 < uVar7;
          uVar14 = (ulong)uVar12;
          uVar7 = uVar12;
        } while (bVar4);
      }
      *(int *)((long)pvVar9 + uVar14 * 4) = iVar5;
      *(uint *)((long)pvVar8 + uVar23 * 4) = uVar7;
      uVar23 = uVar23 + 1;
      pVVar10 = p->vCos;
    } while ((long)uVar23 < (long)pVVar10->nSize);
  }
  uVar6 = p->nObjs;
  vHooks = (Vec_Wec_t *)malloc(0x10);
  uVar7 = 8;
  if (6 < uVar6 - 1) {
    uVar7 = uVar6;
  }
  vHooks->nCap = uVar7;
  if (uVar7 == 0) {
    pVVar10 = (Vec_Int_t *)0x0;
    uVar16 = extraout_RDX;
  }
  else {
    pVVar10 = (Vec_Int_t *)calloc((long)(int)uVar7,0x10);
    uVar16 = extraout_RDX_00;
  }
  iVar5 = (int)uVar16;
  vHooks->pArray = pVVar10;
  vHooks->nSize = uVar6;
  uVar23 = (ulong)(int)__ptr_01[1];
  if ((long)uVar23 < 1) {
    __assert_fail("p->nSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                  ,0x88,"int Vec_QueSize(Vec_Que_t *)");
  }
  if (__ptr_01[1] != 1) {
    do {
      iVar5 = (int)uVar16;
      iVar2 = *(int *)((long)pvVar9 + 4);
      if (*(long *)puVar1 == 0) {
        fVar24 = (float)iVar2;
      }
      else {
        fVar24 = *(float *)(*(long *)puVar1 + (long)iVar2 * 4);
      }
      if (fVar24 < (float)(p->nLevels - nSlackMax)) {
        __ptr_01[1] = (uint)uVar23;
        goto LAB_0073ce66;
      }
      *(undefined4 *)((long)pvVar8 + (long)iVar2 * 4) = 0xffffffff;
      uVar23 = uVar23 - 1;
      if (uVar23 == 1) {
        *(undefined4 *)((long)pvVar9 + 4) = 0xffffffff;
      }
      else {
        iVar5 = *(int *)((long)pvVar9 + uVar23 * 4);
        *(undefined4 *)((long)pvVar9 + uVar23 * 4) = 0xffffffff;
        *(int *)((long)pvVar9 + 4) = iVar5;
        lVar15 = (long)iVar5;
        *(undefined4 *)((long)pvVar8 + lVar15 * 4) = 1;
        lVar22 = *(long *)puVar1;
        if (lVar22 == 0) {
          fVar24 = (float)iVar5;
        }
        else {
          fVar24 = *(float *)(lVar22 + lVar15 * 4);
        }
        uVar12 = 1;
        if (2 < uVar23) {
          uVar20 = 2;
          uVar12 = 1;
          do {
            lVar18 = (long)(int)(uVar20 | 1);
            lVar21 = (long)(int)uVar20;
            uVar19 = uVar20;
            if (lVar18 < (long)uVar23) {
              iVar3 = *(int *)((long)pvVar9 + lVar21 * 4);
              if (lVar22 == 0) {
                fVar25 = (float)iVar3;
                fVar26 = (float)*(int *)((long)pvVar9 + lVar18 * 4);
              }
              else {
                fVar25 = *(float *)(lVar22 + (long)iVar3 * 4);
                fVar26 = *(float *)(lVar22 + (long)*(int *)((long)pvVar9 + lVar18 * 4) * 4);
              }
              if (fVar25 < fVar26) {
                lVar21 = lVar18;
                uVar19 = uVar20 | 1;
              }
            }
            if ((long)uVar23 <= lVar21) {
              __assert_fail("child < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                            ,0xbc,"void Vec_QueMoveDown(Vec_Que_t *, int)");
            }
            iVar3 = *(int *)((long)pvVar9 + lVar21 * 4);
            if (lVar22 == 0) {
              fVar25 = (float)iVar3;
            }
            else {
              fVar25 = *(float *)(lVar22 + (long)iVar3 * 4);
            }
            if (fVar25 <= fVar24) break;
            *(int *)((long)pvVar9 + (long)(int)uVar12 * 4) = iVar3;
            *(uint *)((long)pvVar8 + (long)iVar3 * 4) = uVar12;
            uVar20 = uVar19 * 2;
            uVar12 = uVar19;
          } while ((long)(int)uVar20 < (long)uVar23);
        }
        *(int *)((long)pvVar9 + (long)(int)uVar12 * 4) = iVar5;
        *(uint *)((long)pvVar8 + lVar15 * 4) = uVar12;
      }
      Gia_ManCheckFalseOne(p,iVar2,nTimeOut,vHooks,fVerbose,fVeryVerbose);
      iVar5 = (int)extraout_RDX_01;
      uVar16 = extraout_RDX_01;
    } while (uVar23 != 1);
  }
  __ptr_01[1] = 1;
  if ((float)(p->nLevels - nSlackMax) <= -1e+09) {
    __assert_fail("p->nSize > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecQue.h"
                  ,0xed,"int Vec_QuePop(Vec_Que_t *)");
  }
LAB_0073ce66:
  if (fVerbose != 0) {
    if ((int)uVar6 < 1) {
      uVar23 = 0;
    }
    else {
      lVar22 = 0;
      uVar23 = 0;
      do {
        uVar23 = (ulong)((int)uVar23 + (uint)(0 < *(int *)((long)&pVVar10->nSize + lVar22)));
        lVar22 = lVar22 + 0x10;
      } while ((ulong)uVar6 << 4 != lVar22);
    }
    printf("Collected %d non-overlapping false paths.\n",uVar23);
    iVar5 = extraout_EDX;
  }
  pGVar11 = Gia_ManFalseRebuild(p,vHooks,iVar5,fVeryVerbose);
  if ((int)uVar7 < 1) {
    if (pVVar10 == (Vec_Int_t *)0x0) goto LAB_0073cef7;
  }
  else {
    lVar22 = 0;
    do {
      __ptr = *(void **)((long)&pVVar10->pArray + lVar22);
      if (__ptr != (void *)0x0) {
        free(__ptr);
        *(undefined8 *)((long)&pVVar10->pArray + lVar22) = 0;
      }
      lVar22 = lVar22 + 0x10;
    } while ((ulong)uVar7 << 4 != lVar22);
  }
  free(pVVar10);
LAB_0073cef7:
  free(vHooks);
  if (*(void **)puVar1 != (void *)0x0) {
    free(*(void **)puVar1);
  }
  free(__ptr_00);
  if (pvVar8 != (void *)0x0) {
    free(pvVar8);
    __ptr_01[4] = 0;
    __ptr_01[5] = 0;
    pvVar9 = *(void **)(__ptr_01 + 2);
  }
  if (pvVar9 != (void *)0x0) {
    free(pvVar9);
  }
  free(__ptr_01);
  return pGVar11;
}

Assistant:

Gia_Man_t * Gia_ManCheckFalse2( Gia_Man_t * p, int nSlackMax, int nTimeOut, int fVerbose, int fVeryVerbose )
{
    Gia_Man_t * pNew;
    Vec_Wec_t * vHooks;
    Vec_Que_t * vPrio;
    Vec_Flt_t * vWeights;
    Gia_Obj_t * pObj;
    int i;
//    srand( 111 );
    Gia_ManLevelNum( p );
    // create PO weights
    vWeights = Vec_FltAlloc( Gia_ManCoNum(p) );
    Gia_ManForEachCo( p, pObj, i )
        Vec_FltPush( vWeights, Gia_ObjLevel(p, pObj) );
    // put POs into the queue
    vPrio = Vec_QueAlloc( Gia_ManCoNum(p) );
    Vec_QueSetPriority( vPrio, Vec_FltArrayP(vWeights) );
    Gia_ManForEachCo( p, pObj, i )
        Vec_QuePush( vPrio, i );
    // work on each PO in the queue
    vHooks = Vec_WecStart( Gia_ManObjNum(p) );
    while ( Vec_QueTopPriority(vPrio) >= p->nLevels - nSlackMax )
        Gia_ManCheckFalseOne( p, Vec_QuePop(vPrio), nTimeOut, vHooks, fVerbose, fVeryVerbose );
    if ( fVerbose )
    printf( "Collected %d non-overlapping false paths.\n", Vec_WecSizeUsed(vHooks) );
    // reconstruct the AIG
    pNew = Gia_ManFalseRebuild( p, vHooks, fVerbose, fVeryVerbose );
    // cleanup
    Vec_WecFree( vHooks );
    Vec_FltFree( vWeights );
    Vec_QueFree( vPrio );
    return pNew;
}